

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

PROPERTIES_HANDLE properties_clone(PROPERTIES_HANDLE value)

{
  AMQP_VALUE pAVar1;
  PROPERTIES_HANDLE local_18;
  PROPERTIES_INSTANCE *properties_instance;
  PROPERTIES_HANDLE value_local;
  
  local_18 = (PROPERTIES_HANDLE)malloc(8);
  if (local_18 != (PROPERTIES_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (PROPERTIES_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

PROPERTIES_HANDLE properties_clone(PROPERTIES_HANDLE value)
{
    PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)malloc(sizeof(PROPERTIES_INSTANCE));
    if (properties_instance != NULL)
    {
        properties_instance->composite_value = amqpvalue_clone(((PROPERTIES_INSTANCE*)value)->composite_value);
        if (properties_instance->composite_value == NULL)
        {
            free(properties_instance);
            properties_instance = NULL;
        }
    }

    return properties_instance;
}